

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O2

void __thiscall QSyntaxHighlighter::rehighlightBlock(QSyntaxHighlighter *this,QTextBlock *block)

{
  long lVar1;
  QSyntaxHighlighterPrivate *this_00;
  Data *pDVar2;
  bool bVar3;
  QObject *pQVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  QTextCursor cursor;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSyntaxHighlighterPrivate **)&this->field_0x8;
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)&this_00->doc);
  if (bVar3) {
    bVar3 = QTextBlock::isValid(block);
    if (bVar3) {
      pQVar4 = &QTextBlock::document(block)->super_QObject;
      pDVar2 = (this_00->doc).wp.d;
      if ((pDVar2 == (Data *)0x0) ||
         ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
        pQVar5 = (QObject *)0x0;
      }
      else {
        pQVar5 = (this_00->doc).wp.value;
      }
      if (pQVar5 == pQVar4) {
        bVar3 = this_00->rehighlightPending;
        cursor.d.d.ptr = (QSharedDataPointer<QTextCursorPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        QTextCursor::QTextCursor(&cursor,block);
        QSyntaxHighlighterPrivate::rehighlight(this_00,&cursor,EndOfBlock);
        if (bVar3 == true) {
          this_00->rehighlightPending = true;
        }
        QTextCursor::~QTextCursor(&cursor);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSyntaxHighlighter::rehighlightBlock(const QTextBlock &block)
{
    Q_D(QSyntaxHighlighter);
    if (!d->doc || !block.isValid() || block.document() != d->doc)
        return;

    const bool rehighlightPending = d->rehighlightPending;

    QTextCursor cursor(block);
    d->rehighlight(cursor, QTextCursor::EndOfBlock);

    if (rehighlightPending)
        d->rehighlightPending = rehighlightPending;
}